

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_js_generator.cc
# Opt level: O1

void __thiscall
t_js_generator::parse_imports(t_js_generator *this,t_program *program,string *imports_string)

{
  pointer pcVar1;
  char cVar2;
  istream *piVar3;
  long *plVar4;
  long lVar5;
  runtime_error *prVar6;
  invalid_argument *piVar7;
  size_type *psVar8;
  pointer this_00;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>,_bool>
  pVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> module_import_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> module_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> import_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> episode_file_path;
  string line;
  string import;
  ifstream episode_file;
  stringstream sstream;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  pointer local_450;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  undefined1 *local_3c0 [2];
  undefined1 local_3b0 [16];
  byte abStack_3a0 [488];
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  if (program->recursive_ == true) {
    piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar7,"[-gen js:imports=] option is not usable in recursive code generation mode");
    __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::__cxx11::stringstream::stringstream(local_1b8,(string *)imports_string,_S_out|_S_in);
  local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
  local_440._M_string_length = 0;
  local_440.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1b8,(string *)&local_440,':');
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->imports,
               &local_440);
  }
  this_00 = (this->imports).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_450 = (this->imports).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (this_00 == local_450) {
    piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar7,
               "invalid usage: [-gen js:imports=] requires at least one path (multiple paths are separated by \':\')"
              );
    __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_448 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
               *)&this->module_name_2_import_path;
  do {
    if ((this_00->_M_string_length != 0) &&
       ((this_00->_M_dataplus)._M_p[this_00->_M_string_length - 1] == '/')) {
      std::__cxx11::string::substr((ulong)local_3c0,(ulong)this_00);
      std::__cxx11::string::operator=((string *)this_00,(string *)local_3c0);
      if (local_3c0[0] != local_3b0) {
        operator_delete(local_3c0[0]);
      }
    }
    if (this_00->_M_string_length == 0) {
      piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar7,"empty paths are not allowed in imports");
      __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    std::ifstream::ifstream((string *)local_3c0);
    local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
    local_470._M_string_length = 0;
    local_470.field_2._M_local_buf[0] = '\0';
    local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
    pcVar1 = (this_00->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_510,pcVar1,pcVar1 + this_00->_M_string_length);
    std::__cxx11::string::append((char *)&local_510);
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_510,
                                (ulong)episode_file_name_abi_cxx11_._M_dataplus._M_p);
    local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
    psVar8 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_4b0.field_2._M_allocated_capacity = *psVar8;
      local_4b0.field_2._8_8_ = plVar4[3];
    }
    else {
      local_4b0.field_2._M_allocated_capacity = *psVar8;
      local_4b0._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_4b0._M_string_length = plVar4[1];
    *plVar4 = (long)psVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_510._M_dataplus._M_p != &local_510.field_2) {
      operator_delete(local_510._M_dataplus._M_p);
    }
    std::ifstream::open((string *)local_3c0,(_Ios_Openmode)&local_4b0);
    if ((abStack_3a0[*(long *)(local_3c0[0] + -0x18)] & 5) != 0) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_4d0,"failed to open the file \'",&local_4b0);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_4d0);
      local_510._M_dataplus._M_p = (pointer)*plVar4;
      psVar8 = (size_type *)(plVar4 + 2);
      if ((size_type *)local_510._M_dataplus._M_p == psVar8) {
        local_510.field_2._M_allocated_capacity = *psVar8;
        local_510.field_2._8_8_ = plVar4[3];
        local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
      }
      else {
        local_510.field_2._M_allocated_capacity = *psVar8;
      }
      local_510._M_string_length = plVar4[1];
      *plVar4 = (long)psVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::runtime_error::runtime_error(prVar6,(string *)&local_510);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    while( true ) {
      cVar2 = std::ios::widen((char)*(undefined8 *)(local_3c0[0] + -0x18) +
                              (char)(string *)local_3c0);
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_3c0,(string *)&local_470,cVar2);
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
      lVar5 = std::__cxx11::string::find((char)&local_470,0x3a);
      if (lVar5 == -1) {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_4f0,"the episode file \'",&local_4b0);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_4f0);
        local_530._M_dataplus._M_p = (pointer)*plVar4;
        psVar8 = (size_type *)(plVar4 + 2);
        if ((size_type *)local_530._M_dataplus._M_p == psVar8) {
          local_530.field_2._M_allocated_capacity = *psVar8;
          local_530.field_2._8_8_ = plVar4[3];
          local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
        }
        else {
          local_530.field_2._M_allocated_capacity = *psVar8;
        }
        local_530._M_string_length = plVar4[1];
        *plVar4 = (long)psVar8;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::operator+(&local_4d0,&local_530,&local_470);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_4d0);
        local_510._M_dataplus._M_p = (pointer)*plVar4;
        psVar8 = (size_type *)(plVar4 + 2);
        if ((size_type *)local_510._M_dataplus._M_p == psVar8) {
          local_510.field_2._M_allocated_capacity = *psVar8;
          local_510.field_2._8_8_ = plVar4[3];
          local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
        }
        else {
          local_510.field_2._M_allocated_capacity = *psVar8;
        }
        local_510._M_string_length = plVar4[1];
        *plVar4 = (long)psVar8;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::runtime_error::runtime_error(prVar6,(string *)&local_510);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::substr((ulong)&local_510,(ulong)&local_470);
      std::__cxx11::string::substr((ulong)&local_4d0,(ulong)&local_470);
      if (local_510._M_string_length == 0) {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_4f0,"the episode file \'",&local_4b0);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_4f0);
        local_530._M_dataplus._M_p = (pointer)*plVar4;
        psVar8 = (size_type *)(plVar4 + 2);
        if ((size_type *)local_530._M_dataplus._M_p == psVar8) {
          local_530.field_2._M_allocated_capacity = *psVar8;
          local_530.field_2._8_8_ = plVar4[3];
          local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
        }
        else {
          local_530.field_2._M_allocated_capacity = *psVar8;
        }
        local_530._M_string_length = plVar4[1];
        *plVar4 = (long)psVar8;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::runtime_error::runtime_error(prVar6,(string *)&local_530);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (local_4d0._M_string_length == 0) {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_4f0,"the episode file \'",&local_4b0);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_4f0);
        local_530._M_dataplus._M_p = (pointer)*plVar4;
        psVar8 = (size_type *)(plVar4 + 2);
        if ((size_type *)local_530._M_dataplus._M_p == psVar8) {
          local_530.field_2._M_allocated_capacity = *psVar8;
          local_530.field_2._8_8_ = plVar4[3];
          local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
        }
        else {
          local_530.field_2._M_allocated_capacity = *psVar8;
        }
        local_530._M_string_length = plVar4[1];
        *plVar4 = (long)psVar8;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::runtime_error::runtime_error(prVar6,(string *)&local_530);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::rfind((char)this_00,0x2f);
      std::__cxx11::string::substr((ulong)&local_490,(ulong)this_00);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_490);
      local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
      psVar8 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_4f0.field_2._M_allocated_capacity = *psVar8;
        local_4f0.field_2._8_8_ = plVar4[3];
      }
      else {
        local_4f0.field_2._M_allocated_capacity = *psVar8;
        local_4f0._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_4f0._M_string_length = plVar4[1];
      *plVar4 = (long)psVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_4f0,(ulong)local_4d0._M_dataplus._M_p);
      local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
      psVar8 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_530.field_2._M_allocated_capacity = *psVar8;
        local_530.field_2._8_8_ = plVar4[3];
      }
      else {
        local_530.field_2._M_allocated_capacity = *psVar8;
        local_530._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_530._M_string_length = plVar4[1];
      *plVar4 = (long)psVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
        operator_delete(local_4f0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_490._M_dataplus._M_p != &local_490.field_2) {
        operator_delete(local_490._M_dataplus._M_p);
      }
      pVar9 = std::
              _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              ::_M_emplace<std::__cxx11::string_const&,std::__cxx11::string_const&>
                        (local_448,&local_510,&local_530);
      if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_400,"multiple providers of import path found for ",&local_510);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_400);
        local_420._M_dataplus._M_p = (pointer)*plVar4;
        psVar8 = (size_type *)(plVar4 + 2);
        if ((size_type *)local_420._M_dataplus._M_p == psVar8) {
          local_420.field_2._M_allocated_capacity = *psVar8;
          local_420.field_2._8_8_ = plVar4[3];
          local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
        }
        else {
          local_420.field_2._M_allocated_capacity = *psVar8;
        }
        local_420._M_string_length = plVar4[1];
        *plVar4 = (long)psVar8;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::operator+(&local_3e0,&local_420,&local_530);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_3e0);
        local_490._M_dataplus._M_p = (pointer)*plVar4;
        psVar8 = (size_type *)(plVar4 + 2);
        if ((size_type *)local_490._M_dataplus._M_p == psVar8) {
          local_490.field_2._M_allocated_capacity = *psVar8;
          local_490.field_2._8_8_ = plVar4[3];
          local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
        }
        else {
          local_490.field_2._M_allocated_capacity = *psVar8;
        }
        local_490._M_string_length = plVar4[1];
        *plVar4 = (long)psVar8;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::operator+(&local_4f0,&local_490,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)pVar9.first.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                              ._M_cur.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                       + 0x28));
        std::runtime_error::runtime_error(prVar6,(string *)&local_4f0);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_530._M_dataplus._M_p != &local_530.field_2) {
        operator_delete(local_530._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
        operator_delete(local_4d0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_510._M_dataplus._M_p != &local_510.field_2) {
        operator_delete(local_510._M_dataplus._M_p);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
      operator_delete(local_4b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_470._M_dataplus._M_p != &local_470.field_2) {
      operator_delete(local_470._M_dataplus._M_p);
    }
    std::ifstream::~ifstream((string *)local_3c0);
    this_00 = this_00 + 1;
    if (this_00 == local_450) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_440._M_dataplus._M_p != &local_440.field_2) {
        operator_delete(local_440._M_dataplus._M_p);
      }
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(local_138);
      return;
    }
  } while( true );
}

Assistant:

void t_js_generator::parse_imports(t_program* program, const std::string& imports_string) {
  if (program->get_recursive()) {
    throw std::invalid_argument("[-gen js:imports=] option is not usable in recursive code generation mode");
  }
  std::stringstream sstream(imports_string);
  std::string import;
  while (std::getline(sstream, import, ':')) {
    imports.emplace_back(import);
  }
  if (imports.empty()) {
    throw std::invalid_argument("invalid usage: [-gen js:imports=] requires at least one path "
          "(multiple paths are separated by ':')");
  }
  for (auto& import : imports) {
    // Strip trailing '/'
    if (!import.empty() && import[import.size() - 1] == '/') {
      import = import.substr(0, import.size() - 1);
    }
    if (import.empty()) {
      throw std::invalid_argument("empty paths are not allowed in imports");
    }
    std::ifstream episode_file;
    string line;
    const auto episode_file_path = import + "/" + episode_file_name;
    episode_file.open(episode_file_path);
    if (!episode_file) {
      throw std::runtime_error("failed to open the file '" + episode_file_path + "'");
    }
    while (std::getline(episode_file, line)) {
      const auto separator_position = line.find(':');
      if (separator_position == string::npos) {
        // could not find the separator in the line
        throw std::runtime_error("the episode file '" + episode_file_path + "' is malformed, the line '" + line
          + "' does not have a key:value separator ':'");
      }
      const auto module_name = line.substr(0, separator_position);
      const auto import_path = line.substr(separator_position + 1);
      if (module_name.empty()) {
        throw std::runtime_error("the episode file '" + episode_file_path + "' is malformed, the module name is empty");
      }
      if (import_path.empty()) {
        throw std::runtime_error("the episode file '" + episode_file_path + "' is malformed, the import path is empty");
      }
      const auto module_import_path = import.substr(import.find_last_of('/') + 1) + "/" + import_path;
      const auto result = module_name_2_import_path.emplace(module_name, module_import_path);
      if (!result.second) {
        throw std::runtime_error("multiple providers of import path found for " + module_name
          + "\n\t" + module_import_path + "\n\t" + result.first->second);
      }
    }
  }
}